

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

string * __thiscall
Tokenizer::makeErrorMessage(string *__return_storage_ptr__,Tokenizer *this,string *err)

{
  Mark *this_00;
  ostream *poVar1;
  stringstream ss;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"ERROR: (",8);
  this_00 = Stream::getMark(&this->stream_);
  Mark::to_string_abi_cxx11_(&local_1c8,this_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(err->_M_dataplus)._M_p,err->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string Tokenizer::makeErrorMessage(std::string err) const
{
  std::stringstream ss;
  ss << "ERROR: (" << stream_.getMark().to_string() << ") " << err;
  return ss.str();
}